

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v6::internal::write_exponent<char,fmt::v6::internal::counting_iterator>
          (int exp,counting_iterator it)

{
  size_t in_RSI;
  int in_EDI;
  char *d;
  char *top;
  counting_iterator *in_stack_ffffffffffffff68;
  counting_iterator local_90;
  value_type local_83;
  char local_82 [2];
  counting_iterator local_80;
  value_type local_72;
  char local_71;
  char *local_70;
  counting_iterator local_60;
  value_type local_53;
  char local_52 [2];
  counting_iterator local_50;
  value_type local_42;
  char local_41;
  char *local_40;
  counting_iterator local_30;
  value_type local_23;
  char local_22 [2];
  counting_iterator local_20;
  value_type local_16;
  char local_15;
  int local_14;
  size_t local_10;
  
  local_14 = in_EDI;
  local_10 = in_RSI;
  if (in_EDI < 0) {
    local_15 = '-';
    local_20 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
    counting_iterator::operator*(&local_20);
    counting_iterator::value_type::operator=(&local_16,&local_15);
    local_14 = -local_14;
  }
  else {
    local_22[0] = '+';
    local_30 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
    counting_iterator::operator*(&local_30);
    counting_iterator::value_type::operator=(&local_23,local_22);
  }
  if (99 < local_14) {
    local_40 = basic_data<void>::digits + (local_14 / 100 << 1);
    if (999 < local_14) {
      local_41 = *local_40;
      local_50 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
      counting_iterator::operator*(&local_50);
      counting_iterator::value_type::operator=(&local_42,&local_41);
    }
    local_52[0] = local_40[1];
    local_60 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
    counting_iterator::operator*(&local_60);
    counting_iterator::value_type::operator=(&local_53,local_52);
    local_14 = local_14 % 100;
  }
  local_70 = basic_data<void>::digits + (local_14 << 1);
  local_71 = *local_70;
  local_80 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
  counting_iterator::operator*(&local_80);
  counting_iterator::value_type::operator=(&local_72,&local_71);
  local_82[0] = local_70[1];
  local_90 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
  counting_iterator::operator*(&local_90);
  counting_iterator::value_type::operator=(&local_83,local_82);
  return (counting_iterator)local_10;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}